

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::SolveSOR
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  TPZFMatrix<std::complex<float>_> *pTVar3;
  TPZSkylMatrix<std::complex<float>_> *pTVar4;
  int64_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  complex<float> *pcVar7;
  complex<float> *pcVar8;
  long lVar9;
  long lVar10;
  complex<float> *pcVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double local_e0;
  undefined8 local_d8;
  TPZFMatrix<std::complex<float>_> *local_d0;
  TPZSkylMatrix<std::complex<float>_> *local_c8;
  int64_t local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  TPZFMatrix<std::complex<float>_> *local_a0;
  complex<float> local_98;
  int local_8c;
  long local_88;
  long local_80;
  long local_78;
  TPZFMatrix<std::complex<float>_> *local_70;
  double *local_68;
  long *local_60;
  long local_58;
  complex<float> over;
  
  local_d0 = result;
  local_c8 = this;
  local_a0 = scratch;
  local_70 = F;
  local_60 = numiterations;
  if (residual != F) {
    local_8c = direction;
    local_68 = tol;
    if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
      local_b8 = (complex<float> *)(*tol + *tol + 1.0);
    }
    else {
      fVar14 = Norm(residual);
      local_b8 = (complex<float> *)(double)fVar14;
    }
    if (FromCurrent == 0) {
      (*(local_d0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
    }
    over._M_value._0_4_ = (float)overrelax;
    over._M_value._4_4_ = 0;
    iVar6 = (*(local_c8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable
              ._vptr_TPZSavable[0xc])();
    lVar9 = (local_70->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    local_88 = CONCAT44(extraout_var,iVar6) + -1;
    lVar13 = 0;
    lVar12 = lVar13;
    if (local_8c != -1) {
      local_88 = lVar13;
      lVar12 = CONCAT44(extraout_var,iVar6);
    }
    local_80 = (ulong)(local_8c != -1) * 2 + -1;
    if (lVar9 < 1) {
      lVar9 = lVar13;
    }
    pcVar11 = local_b8;
    local_78 = lVar12;
    while ((lVar13 < *local_60 && (*local_68 <= (double)pcVar11 && (double)pcVar11 != *local_68))) {
      local_58 = lVar13;
      TPZFMatrix<std::complex<float>_>::operator=(local_a0,local_70);
      local_e0 = 0.0;
      lVar13 = 0;
      while (lVar13 != lVar9) {
        lVar10 = local_88;
        local_c0 = lVar13;
        if (local_8c == 1) {
          for (; iVar5 = local_c0, pTVar4 = local_c8, lVar13 = local_88, lVar10 != lVar12;
              lVar10 = lVar10 + local_80) {
            ppcVar1 = (local_c8->fElem).fStore;
            pcVar11 = ppcVar1[lVar10 + 1];
            pcVar2 = ppcVar1[lVar10];
            local_d8 = 0;
            local_b8 = ppcVar1[lVar10];
            pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                               (local_a0,(lVar10 - ((long)pcVar11 - (long)pcVar2 >> 3)) + 1,local_c0
                               );
            pcVar8 = TPZFMatrix<std::complex<float>_>::operator()(local_d0,lVar10,iVar5);
            local_d8 = pcVar8->_M_value;
            pcVar11 = (complex<float> *)
                      ((long)(pTVar4->fElem).fStore[lVar10] + ((long)pcVar11 - (long)pcVar2) + -8);
            lVar12 = (long)pcVar11 - (long)local_b8 >> 3;
            if (lVar12 < 0) {
              lVar12 = -1;
            }
            for (lVar13 = 0; lVar12 + 1 != lVar13; lVar13 = lVar13 + 1) {
              std::operator*(pcVar11,(complex<float> *)&local_d8);
              pcVar7[lVar13]._M_value =
                   CONCAT44((float)(pcVar7[lVar13]._M_value >> 0x20) - extraout_XMM0_Db,
                            (float)pcVar7[lVar13]._M_value - extraout_XMM0_Da);
              pcVar11 = pcVar11 + -1;
            }
            lVar12 = local_78;
          }
          for (; iVar5 = local_c0, pTVar4 = local_c8, lVar13 != lVar12; lVar13 = lVar13 + local_80)
          {
            ppcVar1 = (local_c8->fElem).fStore;
            lVar12 = (long)ppcVar1[lVar13 + 1] - (long)ppcVar1[lVar13];
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(local_a0,lVar13,local_c0);
            local_d8 = pcVar11->_M_value;
            pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                               (local_d0,(lVar13 - (lVar12 >> 3)) + 1,iVar5);
            pcVar2 = (pTVar4->fElem).fStore[lVar13];
            pcVar11 = (complex<float> *)(lVar12 + (long)pcVar2);
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,pcVar7);
              local_d8 = CONCAT44((float)(local_d8 >> 0x20) - extraout_XMM0_Db_01,
                                  (float)local_d8 - extraout_XMM0_Da_01);
              pcVar7 = pcVar7 + 1;
            }
            std::operator*((complex<float> *)&local_d8,(complex<float> *)&local_d8);
            fVar14 = std::abs<float>(&local_98);
            local_e0 = local_e0 + (double)fVar14;
            std::operator*((complex<float> *)&local_d8,&over);
            std::operator/(&local_98,pcVar11);
            local_b8 = (complex<float> *)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
            uStack_b0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(local_d0,lVar13,local_c0);
            pcVar11->_M_value =
                 CONCAT44((float)(pcVar11->_M_value >> 0x20) + local_b8._4_4_,
                          (float)pcVar11->_M_value + (float)local_b8);
            lVar12 = local_78;
          }
        }
        else {
          for (; iVar5 = local_c0, pTVar4 = local_c8, lVar13 = local_88, lVar10 != lVar12;
              lVar10 = lVar10 + local_80) {
            ppcVar1 = (local_c8->fElem).fStore;
            lVar12 = (long)ppcVar1[lVar10 + 1] - (long)ppcVar1[lVar10];
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(local_a0,lVar10,local_c0);
            local_b8 = (complex<float> *)pcVar11->_M_value;
            uStack_b0 = 0;
            pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                               (local_d0,(lVar10 - (lVar12 >> 3)) + 1,iVar5);
            pcVar2 = (pTVar4->fElem).fStore[lVar10];
            pcVar11 = (complex<float> *)(lVar12 + (long)pcVar2);
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,pcVar7);
              local_b8 = (complex<float> *)
                         CONCAT44(local_b8._4_4_ - extraout_XMM0_Db_00,
                                  (float)local_b8 - extraout_XMM0_Da_00);
              uStack_b0 = CONCAT44(uStack_b0._4_4_ - extraout_XMM0_Dd,
                                   (float)uStack_b0 - extraout_XMM0_Dc);
              pcVar7 = pcVar7 + 1;
            }
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(local_a0,lVar10,local_c0);
            pcVar11->_M_value = (_ComplexT)local_b8;
            lVar12 = local_78;
          }
          for (; pTVar3 = local_a0, iVar5 = local_c0, lVar13 != lVar12; lVar13 = lVar13 + local_80)
          {
            ppcVar1 = (local_c8->fElem).fStore;
            pcVar2 = ppcVar1[lVar13];
            local_b8 = (complex<float> *)((long)ppcVar1[lVar13 + 1] - (long)pcVar2);
            pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                               (local_a0,(lVar13 - ((long)local_b8 >> 3)) + 1,local_c0);
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(pTVar3,lVar13,iVar5);
            pTVar3 = local_d0;
            local_d8 = pcVar11->_M_value;
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(local_d0,lVar13,iVar5);
            std::operator*(pcVar2,pcVar11);
            local_d8 = CONCAT44((float)(local_d8 >> 0x20) - extraout_XMM0_Db_03,
                                (float)local_d8 - extraout_XMM0_Da_03);
            std::operator*((complex<float> *)&local_d8,(complex<float> *)&local_d8);
            fVar14 = std::abs<float>(&local_98);
            std::operator*(&over,(complex<float> *)&local_d8);
            std::operator/(&local_98,pcVar2);
            local_d8._0_4_ = extraout_XMM0_Da_04;
            local_d8._4_4_ = extraout_XMM0_Db_04;
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(pTVar3,lVar13,iVar5);
            pcVar11->_M_value =
                 CONCAT44((float)(pcVar11->_M_value >> 0x20) + local_d8._4_4_,
                          (float)pcVar11->_M_value + (float)local_d8);
            pcVar11 = TPZFMatrix<std::complex<float>_>::operator()(pTVar3,lVar13,iVar5);
            local_d8 = pcVar11->_M_value;
            pcVar11 = (complex<float> *)
                      ((long)&local_b8->_M_value + (long)&(local_c8->fElem).fStore[lVar13]->_M_value
                      );
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,(complex<float> *)&local_d8);
              pcVar7->_M_value =
                   CONCAT44((float)(pcVar7->_M_value >> 0x20) - extraout_XMM0_Db_05,
                            (float)pcVar7->_M_value - extraout_XMM0_Da_05);
              pcVar7 = pcVar7 + 1;
            }
            local_e0 = local_e0 + (double)fVar14;
            lVar12 = local_78;
          }
        }
        lVar13 = local_c0 + 1;
      }
      if (local_e0 < 0.0) {
        pcVar11 = (complex<float> *)sqrt(local_e0);
      }
      else {
        pcVar11 = (complex<float> *)SQRT(local_e0);
      }
      lVar13 = local_58 + 1;
    }
    local_b8 = pcVar11;
    if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
      (*(local_c8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x28])(local_c8,local_d0,local_70);
    }
    *local_60 = lVar13;
    *local_68 = (double)local_b8;
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}